

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O2

void Gia_ManIncrSimStop(Gia_Man_t *p)

{
  Vec_Wrd_t *__ptr;
  
  if (p->fIncrSim == 0) {
    __assert_fail("p->fIncrSim",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSim.c"
                  ,0x48e,"void Gia_ManIncrSimStop(Gia_Man_t *)");
  }
  p->fIncrSim = 0;
  p->iPatsPi = 0;
  p->nSimWords = 0;
  p->iTimeStamp = 1;
  Vec_IntFreeP(&p->vTimeStamps);
  __ptr = p->vSims;
  if (__ptr != (Vec_Wrd_t *)0x0) {
    if (__ptr->pArray != (word *)0x0) {
      free(__ptr->pArray);
      p->vSims->pArray = (word *)0x0;
      __ptr = p->vSims;
      if (__ptr == (Vec_Wrd_t *)0x0) {
        return;
      }
    }
    free(__ptr);
    p->vSims = (Vec_Wrd_t *)0x0;
  }
  return;
}

Assistant:

void Gia_ManIncrSimStop( Gia_Man_t * p )
{
    assert( p->fIncrSim );
    p->fIncrSim   = 0;
    p->iPatsPi    = 0;
    p->nSimWords  = 0;
    p->iTimeStamp = 1;
    Vec_IntFreeP( &p->vTimeStamps );
    Vec_WrdFreeP( &p->vSims );
}